

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

SharedData * __thiscall
Clasp::MinimizeBuilder::createShared
          (MinimizeBuilder *this,SharedContext *ctx,SumVec *adjust,CmpWeight *cmp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  MLit *__seed;
  _Iter_comp_iter<Clasp::MinimizeBuilder::CmpWeight> __comp;
  pointer pMVar5;
  WeightVec *pWVar6;
  bool bVar7;
  ulong uVar8;
  SharedMinimizeData *this_00;
  ulong uVar9;
  LevelWeight *x;
  uint local_78;
  size_type local_74;
  _Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit> local_48;
  
  uVar1 = (this->lits_).ebo_.size;
  uVar8 = (ulong)uVar1;
  this_00 = (SharedMinimizeData *)operator_new((ulong)(uVar1 + 1) * 8 + 0x68);
  SharedMinimizeData::SharedMinimizeData(this_00,adjust,optimize);
  uVar9 = (ulong)(this->lits_).ebo_.size;
  if (uVar9 != 0) {
    __seed = (this->lits_).ebo_.buf;
    __comp._M_comp.weights = (CmpWeight)cmp->weights;
    std::_Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit>::
    _Temporary_buffer(&local_48,__seed,uVar9 + 1 >> 1);
    if (local_48._M_buffer == (MLit *)0x0) {
      std::
      __inplace_stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpWeight>>
                (__seed,__seed + uVar9,__comp);
    }
    else {
      std::
      __stable_sort_adaptive<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::MLit*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpWeight>>
                (__seed,__seed + uVar9,local_48._M_buffer,local_48._M_len,__comp);
    }
    operator_delete(local_48._M_buffer);
  }
  if (uVar8 != 0) {
    uVar9 = 0;
    local_74 = 0;
    local_78 = 0;
    do {
      pMVar5 = (this->lits_).ebo_.buf;
      uVar1 = pMVar5[uVar9].lit.rep_;
      uVar2 = pMVar5[uVar9].weight;
      SharedContext::setFrozen(ctx,uVar1 >> 2,true);
      *(uint *)(&(((SharedMinimizeData *)(this_00[1].up_ + -1))->adjust_).ebo_.buf + uVar9) = uVar1;
      *(uint *)((long)this_00[1].up_ + uVar9 * 8 + -0xc) = uVar2;
      pWVar6 = cmp->weights;
      if (pWVar6 != (WeightVec *)0x0) {
        if (uVar9 == 0) {
LAB_00152a89:
          local_74 = (this_00->weights).ebo_.size;
          x = (pWVar6->ebo_).buf + uVar2;
          do {
            bk_lib::
            pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
            ::push_back(&this_00->weights,x);
            iVar3 = *(int *)x;
            x = x + 1;
          } while (iVar3 < 0);
          local_78 = (uint)uVar9;
        }
        else {
          pMVar5 = (this->lits_).ebo_.buf;
          bVar7 = CmpWeight::operator()(cmp,pMVar5 + local_78,pMVar5 + uVar9);
          if (bVar7) goto LAB_00152a89;
        }
        *(size_type *)((long)this_00[1].up_ + uVar9 * 8 + -0xc) = local_74;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  sVar4 = (this_00->weights).ebo_.size;
  *(undefined4 *)(&(((SharedMinimizeData *)(this_00[1].up_ + -1))->adjust_).ebo_.buf + uVar8) = 0;
  *(size_type *)((long)this_00[1].up_ + uVar8 * 8 + -0xc) = sVar4;
  if (cmp->weights != (WeightVec *)0x0) {
    local_48._M_original_len._0_4_ = (adjust->ebo_).size - 1 & 0x7fffffff;
    local_48._M_original_len._4_4_ = 0;
    bk_lib::
    pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
    ::push_back(&this_00->weights,(LevelWeight *)&local_48);
  }
  SharedMinimizeData::resetBounds(this_00);
  return this_00;
}

Assistant:

MinimizeBuilder::SharedData* MinimizeBuilder::createShared(SharedContext& ctx, const SumVec& adjust, const CmpWeight& cmp) {
	const uint32 nLits = static_cast<uint32>(lits_.size());
	SharedData*  ret   = new (::operator new(sizeof(SharedData) + ((nLits + 1)*sizeof(WeightLiteral)))) SharedData(adjust);
	// sort literals by decreasing weight
	std::stable_sort(lits_.begin(), lits_.end(), cmp);
	uint32   last = 0;
	weight_t wIdx = 0;
	for (uint32 i = 0; i != nLits; ++i) {
		WeightLiteral x(lits_[i].lit, lits_[i].weight);
		ctx.setFrozen(x.first.var(), true);
		ret->lits[i] = x;
		if (!cmp.weights) { continue; }
		if (!i || cmp(lits_[last], lits_[i])) {
			last = i;
			wIdx = (weight_t)ret->weights.size();
			for (const SharedData::LevelWeight* w = &(*cmp.weights)[x.second];; ++w) {
				ret->weights.push_back(*w);
				if (!w->next) { break; }
			}
		}
		ret->lits[i].second = wIdx;
	}
	ret->lits[nLits] = WeightLiteral(lit_true(), (weight_t)ret->weights.size());
	if (cmp.weights) {
		ret->weights.push_back(SharedData::LevelWeight((uint32)adjust.size()-1, 0));
	}
	ret->resetBounds();
	return ret;
}